

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spherical.cpp
# Opt level: O2

void __thiscall Spherical::Spherical(Spherical *this,double radius)

{
  Parameterization::Parameterization(&this->super_Parameterization,radius);
  (this->super_Parameterization)._vptr_Parameterization =
       (_func_int **)&PTR_PrintPlot3DHeader_00107c58;
  std::__cxx11::string::assign((char *)&(this->super_Parameterization).name);
  (this->super_Parameterization).Jmax = 200;
  (this->super_Parameterization).Kmax = 100;
  (this->super_Parameterization).Lmax = 1;
  (this->super_Parameterization).Gmax = 1;
  *(undefined4 *)&this->theta1_lb = 0;
  *(undefined4 *)((long)&this->theta1_lb + 4) = 0;
  *(undefined4 *)&this->theta1_ub = 0x54442d18;
  *(undefined4 *)((long)&this->theta1_ub + 4) = 0xc01921fb;
  this->theta2_lb = 3.141592653589793;
  this->theta2_ub = 0.0;
  this->d_theta1 = -0.03157379551346526;
  this->d_theta2 = -0.03173325912716963;
  return;
}

Assistant:

Spherical::Spherical(double radius) : Parameterization(radius) {
  name = "Spherical";

  Jmax = 200;
  Kmax = 100;
  Lmax = 1;
  Gmax = 1;

  theta1_lb =  0.0e0;
  theta1_ub = -2.0e0 * PI;

  d_theta1 = (theta1_ub - theta1_lb) / (double)(Jmax - 1);

  theta2_lb = PI;
  theta2_ub = 0.0e0;

  d_theta2 = (theta2_ub - theta2_lb) / (double)(Kmax - 1);
}